

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceStyleWithTextures::~IfcSurfaceStyleWithTextures
          (IfcSurfaceStyleWithTextures *this)

{
  ~IfcSurfaceStyleWithTextures
            ((IfcSurfaceStyleWithTextures *)
             ((long)&(this->
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleWithTextures,_1UL>).
                     _vptr_ObjectHelper +
             (long)(this->
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleWithTextures,_1UL>).
                   _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcSurfaceStyleWithTextures() : Object("IfcSurfaceStyleWithTextures") {}